

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor.hpp
# Opt level: O0

taylor<double,_2,_12> *
operator+(taylor<double,_2,_12> *__return_storage_ptr__,taylor<double,_2,_12> *t1,
         taylor<double,_2,_12> *t2)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  undefined4 local_1c;
  int i;
  taylor<double,_2,_12> *t2_local;
  taylor<double,_2,_12> *t1_local;
  
  taylor<double,_2,_12>::taylor(__return_storage_ptr__);
  for (local_1c = 0; local_1c < 0x5b; local_1c = local_1c + 1) {
    pdVar3 = taylor<double,_2,_12>::operator[](t1,local_1c);
    dVar1 = *pdVar3;
    pdVar3 = taylor<double,_2,_12>::operator[](t2,local_1c);
    dVar2 = *pdVar3;
    pdVar3 = taylor<double,_2,_12>::operator[](__return_storage_ptr__,local_1c);
    *pdVar3 = dVar1 + dVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

static taylor<T, Nvar, Ndeg> operator+(const taylor<T, Nvar, Ndeg> & t1,
                                       const taylor<T, Nvar, Ndeg> & t2) {
  taylor<T, Nvar, Ndeg> tmp;
  for (int i = 0; i < tmp.size; i++)
    tmp[i] = t1[i] + t2[i];
  return tmp;
}